

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O3

size_t png_safecat(png_charp buffer,size_t bufsize,size_t pos,png_const_charp string)

{
  char *pcVar1;
  char cVar2;
  
  if (pos < bufsize && buffer != (png_charp)0x0) {
    if (string != (png_const_charp)0x0) {
      cVar2 = *string;
      if (pos < bufsize - 1 && cVar2 != '\0') {
        pcVar1 = string + 1;
        do {
          buffer[pos] = cVar2;
          pos = pos + 1;
          cVar2 = *pcVar1;
          if (cVar2 == '\0') break;
          pcVar1 = pcVar1 + 1;
        } while (pos < bufsize - 1);
      }
    }
    buffer[pos] = '\0';
  }
  return pos;
}

Assistant:

size_t
png_safecat(png_charp buffer, size_t bufsize, size_t pos,
    png_const_charp string)
{
   if (buffer != NULL && pos < bufsize)
   {
      if (string != NULL)
         while (*string != '\0' && pos < bufsize-1)
           buffer[pos++] = *string++;

      buffer[pos] = '\0';
   }

   return pos;
}